

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int doindent(int cols)

{
  int iVar1;
  int n;
  int cols_local;
  
  if ((curbp->b_flag & 4U) == 0) {
    iVar1 = cols / curbp->b_tabw;
    if ((iVar1 != 0) && (iVar1 = linsert(iVar1,9), iVar1 == 0)) {
      return 0;
    }
    iVar1 = cols % curbp->b_tabw;
    if ((iVar1 != 0) && (iVar1 = linsert(iVar1,0x20), iVar1 == 0)) {
      return 0;
    }
    n = 1;
  }
  else {
    n = linsert(cols,0x20);
  }
  return n;
}

Assistant:

int
doindent(int cols)
{
	int n;

	if (curbp->b_flag & BFNOTAB)
		return (linsert(cols, ' '));
	if ((n = cols / curbp->b_tabw) != 0 && linsert(n, '\t') == FALSE)
		return (FALSE);
	if ((n = cols % curbp->b_tabw) != 0 && linsert(n, ' ') == FALSE)
		return (FALSE);
	return (TRUE);
}